

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * cmGlobalNinjaGenerator::EncodeRuleName(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char buf [16];
  char local_48 [24];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (name->_M_string_length != 0) {
    pcVar3 = (name->_M_dataplus)._M_p;
    do {
      cVar1 = *pcVar3;
      iVar2 = isalnum((int)cVar1);
      if (((iVar2 == 0) && (cVar1 != '_')) && (cVar1 != '-')) {
        sprintf(local_48,".%02x",(ulong)(uint)(int)*pcVar3);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != (name->_M_dataplus)._M_p + name->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeRuleName(std::string const& name)
{
  // Ninja rule names must match "[a-zA-Z0-9_.-]+".  Use ".xx" to encode
  // "." and all invalid characters as hexadecimal.
  std::string encoded;
  for (std::string::const_iterator i = name.begin(); i != name.end(); ++i) {
    if (isalnum(*i) || *i == '_' || *i == '-') {
      encoded += *i;
    } else {
      char buf[16];
      sprintf(buf, ".%02x", static_cast<unsigned int>(*i));
      encoded += buf;
    }
  }
  return encoded;
}